

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderPackingFunctionTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::gles31::Functional::PackHalf2x16Case::iterate(PackHalf2x16Case *this)

{
  ShaderExecutor *pSVar1;
  int iVar2;
  bool bVar3;
  deUint32 dVar4;
  char *pcVar5;
  float *pfVar6;
  pointer pVVar7;
  reference pVVar8;
  size_type sVar9;
  TestLog *pTVar10;
  MessageBuilder *pMVar11;
  reference pvVar12;
  reference pvVar13;
  float fVar14;
  float y_;
  int local_754;
  int local_734;
  MessageBuilder local_730;
  MessageBuilder local_5b0;
  Hex<8UL> local_430;
  Hex<8UL> local_428;
  MessageBuilder local_420;
  int local_29c;
  int local_298;
  int diff1;
  int diff0;
  deUint16 res1;
  deUint16 res0;
  deUint32 res;
  deUint32 ref;
  int iStack_280;
  deUint16 ref1;
  int iStack_27c;
  deUint16 ref0;
  int valNdx;
  int numFailed;
  int maxPrints;
  int numValues;
  void *out;
  void *in;
  MessageBuilder local_258;
  Float<unsigned_short,_5,_10,_15,_3U> local_d4;
  Float<unsigned_short,_5,_10,_15,_3U> local_d2;
  Vector<float,_2> local_d0;
  __normal_iterator<tcu::Vector<float,_2>_*,_std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>_>
  local_c8;
  __normal_iterator<tcu::Vector<float,_2>_*,_std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>_>
  local_c0;
  iterator inVal;
  deUint32 mantissa;
  int exp;
  int s;
  int c;
  Vec2 v;
  int ndx;
  int maxExp;
  int minExp;
  Vector<float,_2> local_84;
  Vector<float,_2> local_7c;
  Vector<float,_2> local_74 [2];
  Vector<float,_2> local_60;
  undefined1 local_58 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> outputs;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> inputs;
  Random rnd;
  int maxDiff;
  PackHalf2x16Case *this_local;
  
  rnd.m_rnd.z = 0;
  unique0x100012ba = this;
  pcVar5 = tcu::TestNode::getName((TestNode *)this);
  dVar4 = deStringHash(pcVar5);
  de::Random::Random((Random *)
                     ((long)&inputs.
                             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                     dVar4 ^ 0x776002);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  tcu::Vector<float,_2>::Vector(&local_60,0.0,0.0);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_60);
  tcu::Vector<float,_2>::Vector(local_74,0.5,1.0);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,local_74);
  tcu::Vector<float,_2>::Vector(&local_7c,1.0,0.5);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_7c);
  tcu::Vector<float,_2>::Vector(&local_84,-0.5,1.5);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_84);
  tcu::Vector<float,_2>::Vector((Vector<float,_2> *)&maxExp,0.25,0.75);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(value_type *)&maxExp);
  v.m_data[1] = 2.10195e-44;
  for (v.m_data[0] = 0.0; (int)v.m_data[0] < 0x5f; v.m_data[0] = (float)((int)v.m_data[0] + 1)) {
    tcu::Vector<float,_2>::Vector((Vector<float,_2> *)&s);
    for (exp = 0; exp < 2; exp = exp + 1) {
      bVar3 = de::Random::getBool((Random *)
                                  ((long)&inputs.
                                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      local_754 = de::Random::getInt((Random *)
                                     ((long)&inputs.
                                             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)
                                     ,-0xe,0xf);
      dVar4 = de::Random::getUint32
                        ((Random *)
                         ((long)&inputs.
                                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      if (local_754 == 0) {
        local_754 = 1;
      }
      inVal._M_current._4_4_ =
           tcu::Float<unsigned_int,_8,_23,_127,_3U>::construct
                     (bVar3 - 1 | 1,local_754,dVar4 & 0x7fffff | 0x800000);
      fVar14 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::asFloat
                         ((Float<unsigned_int,_8,_23,_127,_3U> *)((long)&inVal._M_current + 4));
      pfVar6 = tcu::Vector<float,_2>::operator[]((Vector<float,_2> *)&s,exp);
      *pfVar6 = fVar14;
    }
    std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
              ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
               &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(value_type *)&s);
  }
  local_c0._M_current =
       (Vector<float,_2> *)
       std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::begin
                 ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                  &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  while( true ) {
    local_c8._M_current =
         (Vector<float,_2> *)
         std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::end
                   ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                    &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage);
    bVar3 = __gnu_cxx::operator!=(&local_c0,&local_c8);
    if (!bVar3) break;
    pVVar7 = __gnu_cxx::
             __normal_iterator<tcu::Vector<float,_2>_*,_std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>_>
             ::operator->(&local_c0);
    pfVar6 = tcu::Vector<float,_2>::x(pVVar7);
    tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float(&local_d2,*pfVar6);
    fVar14 = tcu::Float<unsigned_short,_5,_10,_15,_3U>::asFloat(&local_d2);
    pVVar7 = __gnu_cxx::
             __normal_iterator<tcu::Vector<float,_2>_*,_std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>_>
             ::operator->(&local_c0);
    pfVar6 = tcu::Vector<float,_2>::y(pVVar7);
    tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float(&local_d4,*pfVar6);
    y_ = tcu::Float<unsigned_short,_5,_10,_15,_3U>::asFloat(&local_d4);
    tcu::Vector<float,_2>::Vector(&local_d0,fVar14,y_);
    pVVar8 = __gnu_cxx::
             __normal_iterator<tcu::Vector<float,_2>_*,_std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>_>
             ::operator*(&local_c0);
    *&pVVar8->m_data = local_d0.m_data;
    __gnu_cxx::
    __normal_iterator<tcu::Vector<float,_2>_*,_std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>_>
    ::operator++(&local_c0);
  }
  sVar9 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::size
                    ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                     &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,sVar9);
  pTVar10 = tcu::TestContext::getLog
                      ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_258,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar11 = tcu::MessageBuilder::operator<<(&local_258,(char (*) [22])"Executing shader for ");
  in = (void *)std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::size
                         ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                          &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(unsigned_long *)&in);
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [14])" input values");
  tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_258);
  out = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::operator[]
                  ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                   &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,0);
  _maxPrints = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,0);
  (*((this->super_ShaderPackingFunctionCase).m_executor)->_vptr_ShaderExecutor[5])();
  pSVar1 = (this->super_ShaderPackingFunctionCase).m_executor;
  sVar9 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::size
                    ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                     &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  (*pSVar1->_vptr_ShaderExecutor[6])(pSVar1,sVar9 & 0xffffffff,&out,&maxPrints);
  sVar9 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::size
                    ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                     &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  numFailed = (int)sVar9;
  valNdx = 10;
  iStack_27c = 0;
  for (iStack_280 = 0; iVar2 = iStack_280,
      sVar9 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::size
                        ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                         &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage), iVar2 < (int)sVar9;
      iStack_280 = iStack_280 + 1) {
    pvVar12 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
              operator[]((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                         &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,(long)iStack_280);
    pfVar6 = tcu::Vector<float,_2>::x(pvVar12);
    tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float
              ((Float<unsigned_short,_5,_10,_15,_3U> *)&ref,*pfVar6);
    ref._2_2_ = tcu::Float<unsigned_short,_5,_10,_15,_3U>::bits
                          ((Float<unsigned_short,_5,_10,_15,_3U> *)&ref);
    pvVar12 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
              operator[]((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                         &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,(long)iStack_280);
    pfVar6 = tcu::Vector<float,_2>::y(pvVar12);
    tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float
              ((Float<unsigned_short,_5,_10,_15,_3U> *)&res,*pfVar6);
    res._2_2_ = tcu::Float<unsigned_short,_5,_10,_15,_3U>::bits
                          ((Float<unsigned_short,_5,_10,_15,_3U> *)&res);
    _res1 = CONCAT22(res._2_2_,ref._2_2_);
    pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,
                         (long)iStack_280);
    diff0 = *pvVar13;
    diff1._2_2_ = (undefined2)diff0;
    diff1._0_2_ = (ushort)((uint)diff0 >> 0x10);
    local_298 = de::abs<int>((uint)ref._2_2_ - (diff0 & 0xffffU));
    local_29c = de::abs<int>((uint)res._2_2_ - (uint)(ushort)diff1);
    if ((0 < local_298) || (0 < local_29c)) {
      if (iStack_27c < 10) {
        pTVar10 = tcu::TestContext::getLog
                            ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                             super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_420,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar11 = tcu::MessageBuilder::operator<<
                            (&local_420,(char (*) [26])"ERROR: Mismatch in value ");
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&stack0xfffffffffffffd80);
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [25])", expected packHalf2x16(")
        ;
        pvVar12 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
                  operator[]((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                              *)&outputs.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,(long)iStack_280)
        ;
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,pvVar12);
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [5])0x2bd2712);
        local_428 = tcu::toHex<unsigned_int>(_res1);
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_428);
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [7])0x2c67b94);
        local_430 = tcu::toHex<unsigned_int>(diff0);
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_430);
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [13])"\n  diffs = (");
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_298);
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0x2a4b1eb);
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_29c);
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [15])"), max diff = ");
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(int *)&rnd.m_rnd.z);
        tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_420);
      }
      else if (iStack_27c == 10) {
        pTVar10 = tcu::TestContext::getLog
                            ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                             super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_5b0,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar11 = tcu::MessageBuilder::operator<<(&local_5b0,(char (*) [4])0x2b5ff3d);
        tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_5b0);
      }
      iStack_27c = iStack_27c + 1;
    }
  }
  pTVar10 = tcu::TestContext::getLog
                      ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_730,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
  local_734 = numFailed - iStack_27c;
  pMVar11 = tcu::MessageBuilder::operator<<(&local_730,&local_734);
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [4])0x2b9720c);
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&numFailed);
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [15])" values passed");
  tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_730);
  pcVar5 = "Result comparison failed";
  if (iStack_27c == 0) {
    pcVar5 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,(uint)(iStack_27c != 0),pcVar5);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  de::Random::~Random((Random *)
                      ((long)&inputs.
                              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const int					maxDiff		= 0; // Values can be represented exactly in mediump.
		de::Random					rnd			(deStringHash(getName()) ^ 0x776002);
		std::vector<tcu::Vec2>		inputs;
		std::vector<deUint32>		outputs;

		// Special values to check.
		inputs.push_back(tcu::Vec2(0.0f, 0.0f));
		inputs.push_back(tcu::Vec2(0.5f, 1.0f));
		inputs.push_back(tcu::Vec2(1.0f, 0.5f));
		inputs.push_back(tcu::Vec2(-0.5f, 1.5f));
		inputs.push_back(tcu::Vec2(0.25f, 0.75f));

		// Random values.
		{
			const int	minExp	= -14;
			const int	maxExp	= 15;

			for (int ndx = 0; ndx < 95; ndx++)
			{
				tcu::Vec2 v;
				for (int c = 0; c < 2; c++)
				{
					const int		s			= rnd.getBool() ? 1 : -1;
					const int		exp			= rnd.getInt(minExp, maxExp);
					const deUint32	mantissa	= rnd.getUint32() & ((1<<23)-1);

					v[c] = tcu::Float32::construct(s, exp ? exp : 1 /* avoid denormals */, (1u<<23) | mantissa).asFloat();
				}
				inputs.push_back(v);
			}
		}

		// Convert input values to fp16 and back to make sure they can be represented exactly in mediump.
		for (std::vector<tcu::Vec2>::iterator inVal = inputs.begin(); inVal != inputs.end(); ++inVal)
			*inVal = tcu::Vec2(tcu::Float16(inVal->x()).asFloat(), tcu::Float16(inVal->y()).asFloat());

		outputs.resize(inputs.size());

		m_testCtx.getLog() << TestLog::Message << "Executing shader for " << inputs.size() << " input values" << tcu::TestLog::EndMessage;

		{
			const void*	in	= &inputs[0];
			void*		out	= &outputs[0];

			m_executor->useProgram();
			m_executor->execute((int)inputs.size(), &in, &out);
		}

		// Verify
		{
			const int	numValues	= (int)inputs.size();
			const int	maxPrints	= 10;
			int			numFailed	= 0;

			for (int valNdx = 0; valNdx < (int)inputs.size(); valNdx++)
			{
				const deUint16	ref0	= (deUint16)tcu::Float16(inputs[valNdx].x()).bits();
				const deUint16	ref1	= (deUint16)tcu::Float16(inputs[valNdx].y()).bits();
				const deUint32	ref		= (ref1 << 16) | ref0;
				const deUint32	res		= outputs[valNdx];
				const deUint16	res0	= (deUint16)(res & 0xffff);
				const deUint16	res1	= (deUint16)(res >> 16);
				const int		diff0	= de::abs((int)ref0 - (int)res0);
				const int		diff1	= de::abs((int)ref1 - (int)res1);

				if (diff0 > maxDiff || diff1 > maxDiff)
				{
					if (numFailed < maxPrints)
					{
						m_testCtx.getLog() << TestLog::Message << "ERROR: Mismatch in value " << valNdx
															   << ", expected packHalf2x16(" << inputs[valNdx] << ") = " << tcu::toHex(ref)
															   << ", got " << tcu::toHex(res)
															   << "\n  diffs = (" << diff0 << ", " << diff1 << "), max diff = " << maxDiff
										   << TestLog::EndMessage;
					}
					else if (numFailed == maxPrints)
						m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

					numFailed += 1;
				}
			}

			m_testCtx.getLog() << TestLog::Message << (numValues - numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

			m_testCtx.setTestResult(numFailed == 0 ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									numFailed == 0 ? "Pass"					: "Result comparison failed");
		}

		return STOP;
	}